

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFBStream::iterate(DrawXFBStream *this)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  ContextInfo *pCVar3;
  TestContext *pTVar4;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  bool local_4cf;
  bool local_4cd;
  MessageBuilder local_4c0;
  MessageBuilder local_340;
  MessageBuilder local_1c0;
  byte local_2e;
  bool local_2d;
  int local_2c;
  bool test_error;
  bool is_ok;
  GLint max_vertex_streams;
  bool is_arb_gpu_shader5;
  ApiType AStack_20;
  bool is_arb_tf_3;
  byte local_19;
  long lStack_18;
  bool is_at_least_gl_40;
  Functions *gl;
  DrawXFBStream *this_local;
  
  gl = (Functions *)this;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  AStack_20.m_bits = (*pRVar2->_vptr_RenderContext[2])();
  max_vertex_streams = (GLint)glu::ApiType::core(4,0);
  local_19 = glu::contextSupports((ContextType)AStack_20.m_bits,(ApiType)max_vertex_streams);
  pCVar3 = deqp::Context::getContextInfo(this->m_context);
  is_ok = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_transform_feedback3");
  pCVar3 = deqp::Context::getContextInfo(this->m_context);
  test_error = glu::ContextInfo::isExtensionSupported(pCVar3,"GL_ARB_gpu_shader5");
  local_2c = 0;
  local_2d = true;
  local_2e = 0;
  if (((local_19 & 1) != 0) || (((is_ok & 1U) != 0 && (test_error)))) {
    (**(code **)(lStack_18 + 0x868))(0x8e71,&local_2c);
    err = (**(code **)(lStack_18 + 0x800))();
    glu::checkError(err,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1501);
    if (1 < local_2c) {
      prepareObjects(this);
      useProgram(this,this->m_program_id_generate);
      drawForXFB(this);
      local_4cd = false;
      if ((local_2d & 1U) != 0) {
        local_4cd = inspectQueries(this);
      }
      local_2d = local_4cd;
      useProgram(this,this->m_program_id_draw);
      setupVertexArray(this,this->m_bo_id[0]);
      drawForFramebuffer(this,0);
      setupVertexArray(this,this->m_bo_id[1]);
      drawForFramebuffer(this,1);
      local_4cf = false;
      if ((local_2d & 1U) != 0) {
        local_4cf = check(this);
      }
      local_2d = local_4cf;
    }
  }
  clean(this);
  if ((local_2d & 1U) == 0) {
    if ((local_2e & 1) == 0) {
      pTVar4 = deqp::Context::getTestContext(this->m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_4c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_4c0,(char (*) [29])"Draw XFB Stream have failed.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_4c0);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
    else {
      pTVar4 = deqp::Context::getTestContext(this->m_context);
      pTVar5 = tcu::TestContext::getLog(pTVar4);
      tcu::TestLog::operator<<(&local_340,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar6 = tcu::MessageBuilder::operator<<
                         (&local_340,(char (*) [39])"Draw XFB Stream have approached error.");
      tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_340);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    pTVar4 = deqp::Context::getTestContext(this->m_context);
    pTVar5 = tcu::TestContext::getLog(pTVar4);
    tcu::TestLog::operator<<(&local_1c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_1c0,(char (*) [29])"Draw XFB Stream have passed.");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c0);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFBStream::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_40  = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_3		= m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3");
	bool is_arb_gpu_shader5 = m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader5");

	glw::GLint max_vertex_streams = 0;

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || (is_arb_tf_3 && is_arb_gpu_shader5))
		{
			gl.getIntegerv(GL_MAX_VERTEX_STREAMS, &max_vertex_streams);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

			if (max_vertex_streams >= 2)
			{
				prepareObjects();

				useProgram(m_program_id_generate);

				drawForXFB();

				is_ok = is_ok && inspectQueries();

				useProgram(m_program_id_draw);

				setupVertexArray(m_bo_id[0]);

				drawForFramebuffer(0);

				setupVertexArray(m_bo_id[1]);

				drawForFramebuffer(1);

				is_ok = is_ok && check();
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}